

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::LegacyVectorLimitCase::iterate
          (LegacyVectorLimitCase *this)

{
  GLenum GVar1;
  bool bVar2;
  int iVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestLog *pTVar6;
  int *piVar7;
  Enum<int,_2UL> EVar8;
  GetNameFunc local_288;
  int local_280;
  string local_278;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  GLenum local_1d0;
  undefined1 local_1cc [4];
  deUint32 err;
  StateQueryMemoryWriteGuard<int> value;
  GetNameFunc local_1b0;
  int local_1a8;
  string local_1a0;
  GetNameFunc local_180;
  int local_178;
  GetNameFunc local_170;
  int local_168;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_d9;
  string local_d8;
  ScopedLogSection local_b8;
  ScopedLogSection section;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  LegacyVectorLimitCase *this_local;
  
  pRVar5 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar3),pTVar6);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar6,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"TiedTo",&local_d9);
  EVar8 = glu::getGettableStateStr(this->m_legacyTarget);
  local_180 = EVar8.m_getName;
  local_178 = EVar8.m_value;
  local_170 = local_180;
  local_168 = local_178;
  de::toString<tcu::Format::Enum<int,2ul>>(&local_160,(de *)&local_170,EVar8._8_8_);
  std::operator+(&local_140,&local_160," is ");
  EVar8 = glu::getGettableStateStr(this->m_componentTarget);
  value._4_8_ = EVar8.m_getName;
  local_1a8 = EVar8.m_value;
  local_1b0 = (GetNameFunc)value._4_8_;
  de::toString<tcu::Format::Enum<int,2ul>>(&local_1a0,(de *)&local_1b0,EVar8._8_8_);
  std::operator+(&local_120,&local_140,&local_1a0);
  std::operator+(&local_100,&local_120," divided by four");
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar6,&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int> *)local_1cc);
  GVar1 = this->m_componentTarget;
  piVar7 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                     ((StateQueryMemoryWriteGuard<int> *)local_1cc);
  glu::CallLogWrapper::glGetIntegerv
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),GVar1,piVar7);
  do {
    local_1d0 = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_1d0 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"Got Error ",&local_251);
      EVar8 = glu::getErrorStr(local_1d0);
      local_288 = EVar8.m_getName;
      local_280 = EVar8.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_278,&local_288);
      std::operator+(&local_230,&local_250,&local_278);
      std::operator+(&local_210,&local_230,": ");
      std::operator+(&local_1f0,&local_210,"glGetIntegerv");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator(&local_251);
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  bVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    ((StateQueryMemoryWriteGuard<int> *)local_1cc,(ResultCollector *)local_78);
  if (bVar2) {
    GVar1 = this->m_legacyTarget;
    piVar7 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                       ((StateQueryMemoryWriteGuard *)local_1cc);
    iVar3 = *piVar7;
    if (iVar3 < 0) {
      iVar3 = iVar3 + 3;
    }
    deqp::gls::StateQueryUtil::verifyStateInteger
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               GVar1,iVar3 >> 2,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_b8);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

LegacyVectorLimitCase::IterateResult LegacyVectorLimitCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "TiedTo", de::toString(glu::getGettableStateStr(m_legacyTarget)) +
																			" is " +
																			de::toString(glu::getGettableStateStr(m_componentTarget)) +
																			" divided by four");

		StateQueryMemoryWriteGuard<glw::GLint> value;
		gl.glGetIntegerv(m_componentTarget, &value);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

		if (value.verifyValidity(result))
			verifyStateInteger(result, gl, m_legacyTarget, ((int)value) / 4, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}